

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void ImGui::SameLine(float offset_from_start_x,float spacing_w)

{
  ImGuiWindow_conflict *pIVar1;
  ImGuiContext_conflict1 *pIVar2;
  float fVar3;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    if ((offset_from_start_x != 0.0) || (NAN(offset_from_start_x))) {
      fVar3 = 0.0;
      if (0.0 <= spacing_w) {
        fVar3 = spacing_w;
      }
      fVar3 = ((pIVar1->Pos).x - (pIVar1->Scroll).x) + offset_from_start_x + fVar3 +
              (pIVar1->DC).GroupOffset.x + (pIVar1->DC).ColumnsOffset.x;
    }
    else {
      if (spacing_w < 0.0) {
        spacing_w = (pIVar2->Style).ItemSpacing.x;
      }
      fVar3 = spacing_w + (pIVar1->DC).CursorPosPrevLine.x;
    }
    (pIVar1->DC).CursorPos.x = fVar3;
    (pIVar1->DC).CursorPos.y = (pIVar1->DC).CursorPosPrevLine.y;
    (pIVar1->DC).CurrLineSize = (pIVar1->DC).PrevLineSize;
    (pIVar1->DC).CurrLineTextBaseOffset = (pIVar1->DC).PrevLineTextBaseOffset;
  }
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->WriteAccessed = true; return g.CurrentWindow; }